

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

IXML_Node_conflict * ixmlNode_cloneNode(IXML_Node_conflict *nodeptr,int deep)

{
  IXML_Element *pIVar1;
  IXML_Node_conflict *pIVar2;
  Nodeptr p_Var3;
  IXML_Attr *pIVar4;
  
  if (nodeptr != (IXML_Node_conflict *)0x0) {
    switch(nodeptr->nodeType) {
    case eELEMENT_NODE:
      pIVar1 = ixmlNode_cloneElement((IXML_Element *)nodeptr);
      if (pIVar1 != (IXML_Element *)0x0) {
        pIVar2 = ixmlNode_cloneNodeTreeRecursive(nodeptr->firstAttr,deep);
        (pIVar1->n).firstAttr = pIVar2;
        if (deep != 0) {
          p_Var3 = ixmlNode_cloneNodeTreeRecursive(nodeptr->firstChild,deep);
          (pIVar1->n).firstChild = p_Var3;
          for (; p_Var3 != (IXML_Node_conflict *)0x0; p_Var3 = p_Var3->nextSibling) {
            p_Var3->parentNode = &pIVar1->n;
          }
          (pIVar1->n).nextSibling = (Nodeptr)0x0;
        }
LAB_00107a44:
        (pIVar1->n).parentNode = (Nodeptr)0x0;
        return &pIVar1->n;
      }
      break;
    case eATTRIBUTE_NODE:
      pIVar4 = ixmlNode_cloneAttr((IXML_Attr *)nodeptr);
      if (pIVar4 != (IXML_Attr *)0x0) {
        pIVar4->specified = 1;
        return &pIVar4->n;
      }
      break;
    case eTEXT_NODE:
    case eCDATA_SECTION_NODE:
    case eDOCUMENT_NODE:
      pIVar1 = (IXML_Element *)ixmlNode_cloneNodeTreeRecursive(nodeptr,deep);
      if (pIVar1 != (IXML_Element *)0x0) goto LAB_00107a44;
    }
  }
  return (IXML_Node_conflict *)0x0;
}

Assistant:

IXML_Node *ixmlNode_cloneNode(IXML_Node *nodeptr, int deep)
{
	IXML_Node *node = 0;

	if (!nodeptr) {
		goto end_function;
	}

	switch (nodeptr->nodeType) {
	case eATTRIBUTE_NODE:
		node = (IXML_Node *)ixmlNode_cloneAttrDirect(
			(IXML_Attr *)nodeptr);
		break;
	default:
		node = ixmlNode_cloneNodeTree(nodeptr, deep);
		break;
	}

end_function:
	return node;
}